

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O3

string * __thiscall
pbrt::RGBColorSpace::ToString_abi_cxx11_(string *__return_storage_ptr__,RGBColorSpace *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::SquareMatrix<3>const&,pbrt::SquareMatrix<3>const&>
            (__return_storage_ptr__,
             "[ RGBColorSpace r: %s g: %s b: %s w: %s illuminant: %s RGBToXYZ: %s XYZToRGB: %s ]",
             &this->r,&this->g,&this->b,&this->w,&this->illuminant,&this->XYZFromRGB,
             &this->RGBFromXYZ);
  return __return_storage_ptr__;
}

Assistant:

std::string RGBColorSpace::ToString() const {
    return StringPrintf("[ RGBColorSpace r: %s g: %s b: %s w: %s illuminant: "
                        "%s RGBToXYZ: %s XYZToRGB: %s ]",
                        r, g, b, w, illuminant, XYZFromRGB, RGBFromXYZ);
}